

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O2

int secp256k1_keyagg_cache_load
              (secp256k1_context *ctx,secp256k1_keyagg_cache_internal *cache_i,
              secp256k1_musig_keyagg_cache *cache)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  
  iVar4 = secp256k1_memcmp_var(cache,secp256k1_musig_keyagg_cache_magic,4);
  if (iVar4 != 0) {
    (*(ctx->illegal_callback).fn)
              ("secp256k1_memcmp_var(ptr, secp256k1_musig_keyagg_cache_magic, 4) == 0",
               (ctx->illegal_callback).data);
  }
  else {
    secp256k1_ge_from_bytes(&cache_i->pk,cache->data + 4);
    secp256k1_ge_from_bytes_ext(&cache_i->second_pk,cache->data + 0x44);
    uVar1 = *(undefined8 *)(cache->data + 0x84);
    uVar2 = *(undefined8 *)(cache->data + 0x8c);
    uVar3 = *(undefined8 *)(cache->data + 0x9c);
    *(undefined8 *)(cache_i->pks_hash + 0x10) = *(undefined8 *)(cache->data + 0x94);
    *(undefined8 *)(cache_i->pks_hash + 0x18) = uVar3;
    *(undefined8 *)cache_i->pks_hash = uVar1;
    *(undefined8 *)(cache_i->pks_hash + 8) = uVar2;
    cache_i->parity_acc = cache->data[0xa4] & 1;
    secp256k1_scalar_set_b32(&cache_i->tweak,cache->data + 0xa5,(int *)0x0);
  }
  return (uint)(iVar4 == 0);
}

Assistant:

static int secp256k1_keyagg_cache_load(const secp256k1_context* ctx, secp256k1_keyagg_cache_internal *cache_i, const secp256k1_musig_keyagg_cache *cache) {
    const unsigned char *ptr = cache->data;
    ARG_CHECK(secp256k1_memcmp_var(ptr, secp256k1_musig_keyagg_cache_magic, 4) == 0);
    ptr += 4;
    secp256k1_ge_from_bytes(&cache_i->pk, ptr);
    ptr += 64;
    secp256k1_ge_from_bytes_ext(&cache_i->second_pk, ptr);
    ptr += 64;
    memcpy(cache_i->pks_hash, ptr, 32);
    ptr += 32;
    cache_i->parity_acc = *ptr & 1;
    ptr += 1;
    secp256k1_scalar_set_b32(&cache_i->tweak, ptr, NULL);
    return 1;
}